

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

N_Vector * N_VCloneVectorArray(int count,N_Vector w)

{
  N_Vector *vs;
  N_Vector p_Var1;
  ulong uVar2;
  
  if (0 < count) {
    vs = (N_Vector *)malloc((ulong)(uint)count * 8);
    if (vs != (N_Vector *)0x0) {
      uVar2 = 0;
      while( true ) {
        p_Var1 = (*w->ops->nvclone)(w);
        vs[uVar2] = p_Var1;
        if (p_Var1 == (N_Vector)0x0) break;
        uVar2 = uVar2 + 1;
        if ((uint)count == uVar2) {
          return vs;
        }
      }
      N_VDestroyVectorArray(vs,(int)uVar2 + -1);
    }
  }
  return (N_Vector *)0x0;
}

Assistant:

N_Vector *N_VCloneVectorArray(int count, N_Vector w)
{
  N_Vector *vs = NULL;
  int j;

  if (count <= 0) return(NULL);

  vs = (N_Vector *) malloc(count * sizeof(N_Vector));
  if(vs == NULL) return(NULL);

  for (j = 0; j < count; j++) {
    vs[j] = N_VClone(w);
    if (vs[j] == NULL) {
      N_VDestroyVectorArray(vs, j-1);
      return(NULL);
    }
  }

  return(vs);
}